

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  ImVector<unsigned_int> *pIVar1;
  ImGuiTabItem *tab;
  ImVec4 *pIVar2;
  ImVec4 *pIVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  ImGuiColorMod *pIVar7;
  ImGuiTabItem *pIVar8;
  ImGuiWindow *pIVar9;
  float fVar10;
  float fVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  bool bVar14;
  char *pcVar15;
  ImDrawList *this;
  long lVar16;
  long lVar17;
  undefined8 uVar18;
  int iVar19;
  ulong uVar20;
  char buf [256];
  ImVec2 local_148;
  ImVec2 local_140;
  char local_138 [264];
  
  iVar5 = tab_bar->PrevFrameVisible;
  iVar19 = GImGui->FrameCount + -2;
  pcVar15 = " *Inactive*";
  if (iVar19 <= iVar5) {
    pcVar15 = "";
  }
  ImFormatString(local_138,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                 (ulong)(uint)(tab_bar->Tabs).Size,pcVar15);
  if (iVar5 < iVar19) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  bVar13 = TreeNode(tab_bar,"%s",local_138);
  pIVar12 = GImGui;
  if (iVar5 < iVar19) {
    pIVar7 = (GImGui->ColorStack).Data;
    lVar17 = (long)(GImGui->ColorStack).Size;
    pIVar2 = &pIVar7[lVar17 + -1].BackupValue;
    fVar4 = pIVar2->y;
    fVar10 = pIVar2->z;
    fVar11 = pIVar2->w;
    pIVar3 = (GImGui->Style).Colors + pIVar7[lVar17 + -1].Col;
    pIVar3->x = pIVar2->x;
    pIVar3->y = fVar4;
    pIVar3->z = fVar10;
    pIVar3->w = fVar11;
    (pIVar12->ColorStack).Size = (pIVar12->ColorStack).Size + -1;
  }
  else {
    bVar14 = IsItemHovered(0);
    if (bVar14) {
      this = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0xf,
                          1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar13) {
    if (0 < (tab_bar->Tabs).Size) {
      lVar17 = 0;
      uVar20 = 0;
      do {
        pIVar8 = (tab_bar->Tabs).Data;
        tab = (ImGuiTabItem *)((long)&pIVar8->ID + lVar17);
        PushID(tab);
        bVar13 = SmallButton("<");
        if (bVar13) {
          TabBarQueueReorder(tab_bar,tab,-1);
        }
        pIVar9 = GImGui->CurrentWindow;
        pIVar9->WriteAccessed = true;
        if (pIVar9->SkipItems == false) {
          fVar4 = (pIVar9->DC).CursorPosPrevLine.y;
          (pIVar9->DC).CursorPos.x = (pIVar9->DC).CursorPosPrevLine.x + 2.0;
          (pIVar9->DC).CursorPos.y = fVar4;
          (pIVar9->DC).CurrLineSize = (pIVar9->DC).PrevLineSize;
          (pIVar9->DC).CurrLineTextBaseOffset = (pIVar9->DC).PrevLineTextBaseOffset;
        }
        bVar13 = SmallButton(">");
        if (bVar13) {
          TabBarQueueReorder(tab_bar,tab,1);
        }
        pIVar12 = GImGui;
        pIVar9 = GImGui->CurrentWindow;
        pIVar9->WriteAccessed = true;
        if (pIVar9->SkipItems == false) {
          (pIVar9->DC).CursorPos.x =
               (pIVar12->Style).ItemSpacing.x + (pIVar9->DC).CursorPosPrevLine.x;
          (pIVar9->DC).CursorPos.y = (pIVar9->DC).CursorPosPrevLine.y;
          (pIVar9->DC).CurrLineSize = (pIVar9->DC).PrevLineSize;
          (pIVar9->DC).CurrLineTextBaseOffset = (pIVar9->DC).PrevLineTextBaseOffset;
        }
        uVar6 = *(uint *)((long)&pIVar8->ID + lVar17);
        uVar18 = 0x20;
        if (uVar6 == tab_bar->SelectedTabId) {
          uVar18 = 0x2a;
        }
        lVar16 = (long)*(short *)((long)&pIVar8->NameOffset + lVar17);
        pcVar15 = "";
        if (lVar16 != -1) {
          pcVar15 = (tab_bar->TabsNames).Buf.Data + lVar16;
        }
        Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",
             SUB84((double)*(float *)((long)&pIVar8->Offset + lVar17),0),
             (double)*(float *)((long)&pIVar8->Width + lVar17),
             (double)*(float *)((long)&pIVar8->ContentWidth + lVar17),uVar20 & 0xffffffff,uVar18,
             (ulong)uVar6,pcVar15);
        pIVar1 = &GImGui->CurrentWindow->IDStack;
        pIVar1->Size = pIVar1->Size + -1;
        uVar20 = uVar20 + 1;
        lVar17 = lVar17 + 0x24;
      } while ((long)uVar20 < (long)(tab_bar->Tabs).Size);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    IM_UNUSED(p);
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(tab_bar, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}